

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void JS_ComputeMemoryUsage(JSRuntime *rt,JSMemoryUsage *s)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  list_head *plVar5;
  list_head *plVar6;
  list_head *plVar7;
  JSShape *pJVar8;
  size_t sVar9;
  int64_t iVar10;
  int64_t iVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  JSShape **ppJVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  list_head *plVar23;
  list_head **pplVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  JSMemoryUsage_helper local_98;
  long local_58;
  int64_t local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_98.js_func_pc2line_count = 0;
  local_98.js_func_pc2line_size = 0;
  local_98.js_func_size = 0.0;
  local_98.js_func_code_size = 0;
  local_98.str_size = 0.0;
  local_98.js_func_count = 0;
  local_98.memory_used_count = 0.0;
  local_98.str_count = 0.0;
  memset(s,0,0xd0);
  s->malloc_count = (rt->malloc_state).malloc_count;
  sVar9 = (rt->malloc_state).malloc_limit;
  s->malloc_size = (rt->malloc_state).malloc_size;
  s->malloc_limit = sVar9;
  s->memory_used_count = 2;
  s->memory_used_size = (long)rt->class_count * 0x10 + 400;
  plVar5 = &rt->context_list;
  while (plVar5 = plVar5->next, plVar5 != &rt->context_list) {
    plVar23 = plVar5[1].next;
    s->memory_used_count = s->memory_used_count + 2;
    s->memory_used_size = (long)rt->class_count * 0x10 + s->memory_used_size + 0x1c0;
    s->binary_object_count = s->binary_object_count + (ulong)*(ushort *)&plVar5[1].prev;
    s->binary_object_size = s->binary_object_size + (long)*(int *)((long)&plVar5[1].prev + 4);
    if ((plVar23 != (list_head *)0x0) && (*(char *)&plVar23[1].next == '\0')) {
      iVar22 = *(int *)&plVar23[2].prev;
      s->shape_count = s->shape_count + 1;
      s->shape_size =
           (long)(iVar22 + 1) * 4 + s->shape_size + (long)*(int *)((long)&plVar23[2].prev + 4) * 8 +
           0x40;
    }
    for (plVar23 = plVar5 + 0x18; plVar23 = plVar23->prev,
        plVar23 != (list_head *)&plVar5[0x17].next; plVar23 = (list_head *)&plVar23->next) {
      lVar19 = s->memory_used_count;
      lVar17 = lVar19 + 1;
      s->memory_used_count = lVar17;
      lVar15 = s->memory_used_size + 0xa8;
      s->memory_used_size = lVar15;
      if (plVar23[1].prev != (list_head *)0x0) {
        lVar17 = lVar19 + 2;
        s->memory_used_count = lVar17;
        lVar15 = lVar15 + (long)*(int *)&plVar23[1].next * 0x10;
        s->memory_used_size = lVar15;
      }
      if (plVar23[2].prev != (list_head *)0x0) {
        s->memory_used_count = lVar17 + 1;
        uVar14 = (ulong)*(int *)&plVar23[2].next;
        s->memory_used_size = uVar14 * 0x20 + lVar15;
        lVar17 = 8;
        for (lVar19 = 0; lVar19 < (int)uVar14; lVar19 = lVar19 + 1) {
          plVar6 = plVar23[2].prev;
          if ((*(int *)((long)&plVar6->next + lVar17) == 0) &&
             (*(long *)((long)&plVar6->prev + lVar17) != 0)) {
            s->memory_used_count = s->memory_used_count + 1;
            compute_value_size(*(JSValue *)(*(long *)((long)&plVar6->prev + lVar17) + 0x20),
                               &local_98);
            uVar14 = (ulong)*(uint *)&plVar23[2].next;
          }
          lVar17 = lVar17 + 0x20;
        }
      }
      if (plVar23[3].prev != (list_head *)0x0) {
        s->memory_used_count = s->memory_used_count + 1;
        s->memory_used_size = s->memory_used_size + (long)*(int *)&plVar23[3].next * 4;
      }
      if (plVar23[4].prev != (list_head *)0x0) {
        s->memory_used_count = s->memory_used_count + 1;
        s->memory_used_size = s->memory_used_size + (long)*(int *)&plVar23[4].next * 0xc;
      }
      compute_value_size((JSValue)plVar23[5],&local_98);
      compute_value_size((JSValue)plVar23[6],&local_98);
    }
  }
  plVar5 = &rt->gc_obj_list;
LAB_00117404:
  while( true ) {
    plVar5 = plVar5->next;
    if (plVar5 == &rt->gc_obj_list) {
      lVar17 = s->obj_count;
      lVar19 = lVar17 * 0x48 + s->obj_size;
      s->obj_size = lVar19;
      uVar3 = rt->shape_hash_size;
      lVar15 = (long)(int)uVar3 * 8 + s->memory_used_size;
      s->memory_used_size = lVar15;
      uVar14 = 0;
      uVar16 = 0;
      if (0 < (int)uVar3) {
        uVar16 = (ulong)uVar3;
      }
      for (; uVar14 != uVar16; uVar14 = uVar14 + 1) {
        ppJVar18 = rt->shape_hash + uVar14;
        while (pJVar8 = *ppJVar18, pJVar8 != (JSShape *)0x0) {
          uVar4 = pJVar8->prop_hash_mask;
          s->shape_count = s->shape_count + 1;
          s->shape_size =
               (long)(int)(uVar4 + 1) * 4 + s->shape_size + (long)pJVar8->prop_size * 8 + 0x40;
          ppJVar18 = &pJVar8->shape_hash_next;
        }
      }
      lVar21 = s->memory_used_count + 3;
      s->memory_used_count = lVar21;
      local_38 = (long)rt->atom_count;
      s->atom_count = local_38;
      uVar3 = rt->atom_size;
      lVar20 = (long)(int)uVar3 * 8 + (long)rt->atom_hash_size * 4;
      s->atom_size = lVar20;
      uVar14 = 0;
      uVar16 = 0;
      if (0 < (int)uVar3) {
        uVar16 = (ulong)uVar3;
      }
      for (; uVar16 != uVar14; uVar14 = uVar14 + 1) {
        if (((ulong)rt->atom_array[uVar14] & 1) == 0) {
          uVar3 = *(uint *)&rt->atom_array[uVar14]->field_0x4;
          lVar20 = (lVar20 - (ulong)((int)uVar3 < 0)) +
                   (long)(int)((uVar3 & 0x7fffffff) << (byte)(uVar3 >> 0x1f)) + 0x11;
          s->atom_size = lVar20;
        }
      }
      dVar26 = round(local_98.str_count);
      local_58 = (long)dVar26;
      s->str_count = local_58;
      dVar26 = round(local_98.str_size);
      iVar10 = local_98.js_func_count;
      local_40 = (long)dVar26;
      s->str_size = local_40;
      s->js_func_count = local_98.js_func_count;
      dVar26 = round(local_98.js_func_size);
      iVar11 = local_98.js_func_pc2line_count;
      s->js_func_size = (long)dVar26;
      local_48 = local_98.js_func_code_size;
      s->js_func_code_size = local_98.js_func_code_size;
      s->js_func_pc2line_count = local_98.js_func_pc2line_count;
      local_50 = local_98.js_func_pc2line_size;
      s->js_func_pc2line_size = local_98.js_func_pc2line_size;
      dVar27 = round(local_98.memory_used_count);
      s->memory_used_count =
           (long)((double)lVar21 +
                 (double)iVar11 +
                 (double)iVar10 +
                 (double)s->shape_count +
                 (double)lVar17 + (double)local_58 + (double)(int)local_38 + dVar27);
      s->memory_used_size =
           lVar20 + local_50 + (long)dVar26 + local_48 + lVar15 + lVar19 + local_40 + s->prop_size +
           s->shape_size;
      return;
    }
    if (((ulong)plVar5[-1].next & 0xf00000000) == 0) break;
    if (((ulong)plVar5[-1].next & 0xf00000000) == 0x100000000) {
      iVar22 = 0x60;
      if (plVar5[2].next != (list_head *)0x0) {
        iVar22 = ((uint)*(ushort *)((long)&plVar5[3].next + 2) + (uint)*(ushort *)&plVar5[3].next) *
                 0x10 + 0x60;
      }
      if (plVar5[4].next != (list_head *)0x0) {
        iVar2 = *(int *)&plVar5[5].prev;
        lVar17 = 8;
        iVar13 = iVar2;
        for (lVar19 = 0; lVar19 < iVar13; lVar19 = lVar19 + 1) {
          val.tag = *(int64_t *)((long)&(plVar5[4].next)->prev + lVar17);
          val.u.ptr = ((JSValueUnion *)((long)plVar5[4].next + lVar17 + -8))->ptr;
          compute_value_size(val,&local_98);
          iVar13 = *(int *)&plVar5[5].prev;
          lVar17 = lVar17 + 0x10;
        }
        iVar22 = iVar22 + iVar2 * 0x10;
      }
      if (plVar5[3].prev != (list_head *)0x0) {
        iVar22 = iVar22 + *(int *)((long)&plVar5[5].prev + 4) * 8;
      }
      uVar1 = *(ushort *)((long)&plVar5[1].prev + 1);
      if (((uVar1 >> 0xc & 1) == 0) && (plVar5[1].next != (list_head *)0x0)) {
        local_98.js_func_code_size = local_98.js_func_code_size + *(int *)&plVar5[2].prev;
      }
      bVar12 = 0;
      if ((uVar1 >> 10 & 1) != 0) {
        bVar25 = plVar5[7].prev == (list_head *)0x0;
        if (bVar25) {
          iVar22 = iVar22 + 0x20;
        }
        else {
          iVar22 = iVar22 + *(int *)&plVar5[6].prev + 0x21;
        }
        bVar12 = !bVar25;
        lVar17 = (long)*(int *)((long)&plVar5[6].prev + 4);
        if (lVar17 != 0) {
          bVar12 = bVar12 + 1;
          local_98.js_func_pc2line_count = local_98.js_func_pc2line_count + 1;
          local_98.js_func_pc2line_size = lVar17 + local_98.js_func_pc2line_size;
        }
      }
      local_98.js_func_size = (double)iVar22 + local_98.js_func_size;
      local_98.js_func_count = local_98.js_func_count + 1;
      local_98.memory_used_count = (double)bVar12 + local_98.memory_used_count;
    }
  }
  plVar23 = plVar5[1].prev;
  s->obj_count = s->obj_count + 1;
  if (plVar5[1].next != (list_head *)0x0) {
    s->memory_used_count = s->memory_used_count + 1;
    s->prop_size = s->prop_size + (long)*(int *)((long)&plVar23[2].prev + 4) * 0x10;
    uVar14 = (ulong)*(int *)&plVar23[2].next;
    s->prop_count = s->prop_count + uVar14;
    lVar17 = 8;
    for (lVar19 = 0; lVar19 < (int)uVar14; lVar19 = lVar19 + 1) {
      if ((*(int *)((long)&plVar23[4].prev + lVar19 * 8 + 4) != 0) &&
         (*(uint *)(&plVar23[4].prev + lVar19) < 0x40000000)) {
        val_00.tag = *(int64_t *)((long)&(plVar5[1].next)->prev + lVar17);
        val_00.u.ptr = ((JSValueUnion *)((long)plVar5[1].next + lVar17 + -8))->ptr;
        compute_value_size(val_00,&local_98);
        uVar14 = (ulong)*(uint *)&plVar23[2].next;
      }
      lVar17 = lVar17 + 0x10;
    }
  }
  if (*(char *)&plVar23[1].next == '\0') {
    iVar22 = *(int *)&plVar23[2].prev;
    s->shape_count = s->shape_count + 1;
    s->shape_size =
         (long)(iVar22 + 1) * 4 + s->shape_size + (long)*(int *)((long)&plVar23[2].prev + 4) * 8 +
         0x40;
  }
  switch(*(undefined2 *)((long)&plVar5[-1].next + 6)) {
  case 2:
  case 8:
    s->array_count = s->array_count + 1;
    if ((((ulong)plVar5[-1].next & 0x80000000000) != 0) &&
       (s->fast_array_count = s->fast_array_count + 1, plVar5[3].prev != (list_head *)0x0)) {
      s->memory_used_count = s->memory_used_count + 1;
      s->memory_used_size = s->memory_used_size + (ulong)*(uint *)&plVar5[3].next * 0x10;
      s->fast_array_elements = s->fast_array_elements + (ulong)*(uint *)&plVar5[3].next;
      lVar17 = 8;
      for (uVar14 = 0; uVar14 < *(uint *)&plVar5[3].next; uVar14 = uVar14 + 1) {
        val_01.tag = *(int64_t *)((long)&(plVar5[3].prev)->prev + lVar17);
        val_01.u.ptr = ((JSValueUnion *)((long)plVar5[3].prev + lVar17 + -8))->ptr;
        compute_value_size(val_01,&local_98);
        lVar17 = lVar17 + 0x10;
      }
    }
    goto LAB_00117404;
  default:
    if (plVar5[2].next != (list_head *)0x0) {
      s->memory_used_count = s->memory_used_count + 1;
    }
    goto LAB_00117404;
  case 4:
  case 5:
  case 6:
  case 7:
  case 10:
    compute_value_size(*(JSValue *)&plVar5[2].next,&local_98);
    goto LAB_00117404;
  case 0xc:
    s->c_func_count = s->c_func_count + 1;
    goto LAB_00117404;
  case 0xd:
    plVar23 = plVar5[3].prev;
    if (plVar23 != (list_head *)0x0) {
      plVar6 = plVar5[2].next;
      s->memory_used_count = s->memory_used_count + 1;
      uVar14 = (ulong)*(int *)((long)&plVar6[5].next + 4);
      s->js_func_size = s->js_func_size + uVar14 * 8;
      for (lVar17 = 0; lVar17 < (int)uVar14; lVar17 = lVar17 + 1) {
        plVar7 = (&plVar23->prev)[lVar17];
        if (plVar7 != (list_head *)0x0) {
          iVar22 = *(int *)&plVar7->prev;
          s->memory_used_count = (long)((double)s->memory_used_count + 1.0 / (double)iVar22);
          s->js_func_size = (long)((double)s->js_func_size + 48.0 / (double)iVar22);
          if (plVar7[1].next == plVar7 + 2) {
            compute_value_size((JSValue)plVar7[2],&local_98);
            uVar14 = (ulong)*(uint *)((long)&plVar6[5].next + 4);
          }
        }
      }
    }
    goto LAB_00117404;
  case 0xe:
    plVar6 = plVar5[2].next;
    plVar23 = plVar6 + 3;
    for (lVar17 = 0; lVar19 = (long)*(int *)&plVar6[2].prev, lVar17 < lVar19; lVar17 = lVar17 + 1) {
      val_02.tag = (int64_t)plVar23->prev;
      val_02.u = (JSValueUnion)(JSValueUnion)plVar23[-1].next;
      compute_value_size(val_02,&local_98);
      plVar23 = plVar23 + 1;
    }
    s->memory_used_count = s->memory_used_count + 1;
    lVar17 = lVar19 * 0x10 + s->memory_used_size + 0x28;
    break;
  case 0xf:
    plVar23 = plVar5[2].next;
    if (plVar23 == (list_head *)0x0) goto LAB_00117404;
    pplVar24 = &plVar23[1].next;
    for (uVar14 = 0; bVar12 = *(byte *)((long)&plVar23->next + 1), uVar14 < bVar12;
        uVar14 = uVar14 + 1) {
      val_03.tag = (int64_t)*pplVar24;
      val_03.u.ptr = ((JSValueUnion *)(pplVar24 + -1))->ptr;
      compute_value_size(val_03,&local_98);
      pplVar24 = pplVar24 + 2;
    }
    s->memory_used_count = s->memory_used_count + 1;
    lVar17 = (ulong)bVar12 * 0x10 + s->memory_used_size + 0x10;
    break;
  case 0x11:
    if (plVar5[2].next != (list_head *)0x0) {
      compute_value_size((JSValue)*plVar5[2].next,&local_98);
      s->memory_used_count = s->memory_used_count + 1;
      s->memory_used_size = s->memory_used_size + 0x20;
    }
    goto LAB_00117404;
  case 0x12:
    compute_jsstring_size((JSString *)plVar5[2].next,&local_98);
    compute_jsstring_size((JSString *)plVar5[3].prev,&local_98);
    goto LAB_00117404;
  case 0x13:
  case 0x14:
    goto switchD_00117545_caseD_13;
  }
  s->memory_used_size = lVar17;
  goto LAB_00117404;
switchD_00117545_caseD_13:
  plVar23 = plVar5[2].next;
  if (plVar23 != (list_head *)0x0) {
    lVar17 = s->memory_used_count;
    s->memory_used_count = lVar17 + 1;
    lVar19 = s->memory_used_size + 0x30;
    s->memory_used_size = lVar19;
    if (plVar23->next != (list_head *)0x0) {
      s->memory_used_count = lVar17 + 2;
      s->memory_used_size = lVar19 + *(int *)&plVar23->prev;
    }
  }
  goto LAB_00117404;
}

Assistant:

void JS_ComputeMemoryUsage(JSRuntime *rt, JSMemoryUsage *s)
{
    struct list_head *el, *el1;
    int i;
    JSMemoryUsage_helper mem = { 0 }, *hp = &mem;

    memset(s, 0, sizeof(*s));
    s->malloc_count = rt->malloc_state.malloc_count;
    s->malloc_size = rt->malloc_state.malloc_size;
    s->malloc_limit = rt->malloc_state.malloc_limit;

    s->memory_used_count = 2; /* rt + rt->class_array */
    s->memory_used_size = sizeof(JSRuntime) + sizeof(JSValue) * rt->class_count;

    list_for_each(el, &rt->context_list) {
        JSContext *ctx = list_entry(el, JSContext, link);
        JSShape *sh = ctx->array_shape;
        s->memory_used_count += 2; /* ctx + ctx->class_proto */
        s->memory_used_size += sizeof(JSContext) +
            sizeof(JSValue) * rt->class_count;
        s->binary_object_count += ctx->binary_object_count;
        s->binary_object_size += ctx->binary_object_size;

        /* the hashed shapes are counted separately */
        if (sh && !sh->is_hashed) {
            int hash_size = sh->prop_hash_mask + 1;
            s->shape_count++;
            s->shape_size += get_shape_size(hash_size, sh->prop_size);
        }
        list_for_each(el1, &ctx->loaded_modules) {
            JSModuleDef *m = list_entry(el1, JSModuleDef, link);
            s->memory_used_count += 1;
            s->memory_used_size += sizeof(*m);
            if (m->req_module_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->req_module_entries_count * sizeof(*m->req_module_entries);
            }
            if (m->export_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->export_entries_count * sizeof(*m->export_entries);
                for (i = 0; i < m->export_entries_count; i++) {
                    JSExportEntry *me = &m->export_entries[i];
                    if (me->export_type == JS_EXPORT_TYPE_LOCAL && me->u.local.var_ref) {
                        /* potential multiple count */
                        s->memory_used_count += 1;
                        compute_value_size(me->u.local.var_ref->value, hp);
                    }
                }
            }
            if (m->star_export_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->star_export_entries_count * sizeof(*m->star_export_entries);
            }
            if (m->import_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->import_entries_count * sizeof(*m->import_entries);
            }
            compute_value_size(m->module_ns, hp);
            compute_value_size(m->func_obj, hp);
        }
    }

    list_for_each(el, &rt->gc_obj_list) {
        JSGCObjectHeader *gp = list_entry(el, JSGCObjectHeader, link);
        JSObject *p;
        JSShape *sh;
        JSShapeProperty *prs;

        /* XXX: could count the other GC object types too */
        if (gp->gc_obj_type == JS_GC_OBJ_TYPE_FUNCTION_BYTECODE) {
            compute_bytecode_size((JSFunctionBytecode *)gp, hp);
            continue;
        } else if (gp->gc_obj_type != JS_GC_OBJ_TYPE_JS_OBJECT) {
            continue;
        }
        p = (JSObject *)gp;
        sh = p->shape;
        s->obj_count++;
        if (p->prop) {
            s->memory_used_count++;
            s->prop_size += sh->prop_size * sizeof(*p->prop);
            s->prop_count += sh->prop_count;
            prs = get_shape_prop(sh);
            for(i = 0; i < sh->prop_count; i++) {
                JSProperty *pr = &p->prop[i];
                if (prs->atom != JS_ATOM_NULL && !(prs->flags & JS_PROP_TMASK)) {
                    compute_value_size(pr->u.value, hp);
                }
                prs++;
            }
        }
        /* the hashed shapes are counted separately */
        if (!sh->is_hashed) {
            int hash_size = sh->prop_hash_mask + 1;
            s->shape_count++;
            s->shape_size += get_shape_size(hash_size, sh->prop_size);
        }

        switch(p->class_id) {
        case JS_CLASS_ARRAY:             /* u.array | length */
        case JS_CLASS_ARGUMENTS:         /* u.array | length */
            s->array_count++;
            if (p->fast_array) {
                s->fast_array_count++;
                if (p->u.array.u.values) {
                    s->memory_used_count++;
                    s->memory_used_size += p->u.array.count *
                        sizeof(*p->u.array.u.values);
                    s->fast_array_elements += p->u.array.count;
                    for (i = 0; i < p->u.array.count; i++) {
                        compute_value_size(p->u.array.u.values[i], hp);
                    }
                }
            }
            break;
        case JS_CLASS_NUMBER:            /* u.object_data */
        case JS_CLASS_STRING:            /* u.object_data */
        case JS_CLASS_BOOLEAN:           /* u.object_data */
        case JS_CLASS_SYMBOL:            /* u.object_data */
        case JS_CLASS_DATE:              /* u.object_data */
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT:           /* u.object_data */
        case JS_CLASS_BIG_FLOAT:         /* u.object_data */
        case JS_CLASS_BIG_DECIMAL:         /* u.object_data */
#endif
            compute_value_size(p->u.object_data, hp);
            break;
        case JS_CLASS_C_FUNCTION:        /* u.cfunc */
            s->c_func_count++;
            break;
        case JS_CLASS_BYTECODE_FUNCTION: /* u.func */
            {
                JSFunctionBytecode *b = p->u.func.function_bytecode;
                JSVarRef **var_refs = p->u.func.var_refs;
                /* home_object: object will be accounted for in list scan */
                if (var_refs) {
                    s->memory_used_count++;
                    s->js_func_size += b->closure_var_count * sizeof(*var_refs);
                    for (i = 0; i < b->closure_var_count; i++) {
                        if (var_refs[i]) {
                            double ref_count = var_refs[i]->header.ref_count;
                            s->memory_used_count += 1 / ref_count;
                            s->js_func_size += sizeof(*var_refs[i]) / ref_count;
                            /* handle non object closed values */
                            if (var_refs[i]->pvalue == &var_refs[i]->value) {
                                /* potential multiple count */
                                compute_value_size(var_refs[i]->value, hp);
                            }
                        }
                    }
                }
            }
            break;
        case JS_CLASS_BOUND_FUNCTION:    /* u.bound_function */
            {
                JSBoundFunction *bf = p->u.bound_function;
                /* func_obj and this_val are objects */
                for (i = 0; i < bf->argc; i++) {
                    compute_value_size(bf->argv[i], hp);
                }
                s->memory_used_count += 1;
                s->memory_used_size += sizeof(*bf) + bf->argc * sizeof(*bf->argv);
            }
            break;
        case JS_CLASS_C_FUNCTION_DATA:   /* u.c_function_data_record */
            {
                JSCFunctionDataRecord *fd = p->u.c_function_data_record;
                if (fd) {
                    for (i = 0; i < fd->data_len; i++) {
                        compute_value_size(fd->data[i], hp);
                    }
                    s->memory_used_count += 1;
                    s->memory_used_size += sizeof(*fd) + fd->data_len * sizeof(*fd->data);
                }
            }
            break;
        case JS_CLASS_REGEXP:            /* u.regexp */
            compute_jsstring_size(p->u.regexp.pattern, hp);
            compute_jsstring_size(p->u.regexp.bytecode, hp);
            break;

        case JS_CLASS_FOR_IN_ITERATOR:   /* u.for_in_iterator */
            {
                JSForInIterator *it = p->u.for_in_iterator;
                if (it) {
                    compute_value_size(it->obj, hp);
                    s->memory_used_count += 1;
                    s->memory_used_size += sizeof(*it);
                }
            }
            break;
        case JS_CLASS_ARRAY_BUFFER:      /* u.array_buffer */
        case JS_CLASS_SHARED_ARRAY_BUFFER: /* u.array_buffer */
            {
                JSArrayBuffer *abuf = p->u.array_buffer;
                if (abuf) {
                    s->memory_used_count += 1;
                    s->memory_used_size += sizeof(*abuf);
                    if (abuf->data) {
                        s->memory_used_count += 1;
                        s->memory_used_size += abuf->byte_length;
                    }
                }
            }
            break;
        case JS_CLASS_GENERATOR:         /* u.generator_data */
        case JS_CLASS_UINT8C_ARRAY:      /* u.typed_array / u.array */
        case JS_CLASS_INT8_ARRAY:        /* u.typed_array / u.array */
        case JS_CLASS_UINT8_ARRAY:       /* u.typed_array / u.array */
        case JS_CLASS_INT16_ARRAY:       /* u.typed_array / u.array */
        case JS_CLASS_UINT16_ARRAY:      /* u.typed_array / u.array */
        case JS_CLASS_INT32_ARRAY:       /* u.typed_array / u.array */
        case JS_CLASS_UINT32_ARRAY:      /* u.typed_array / u.array */
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT64_ARRAY:   /* u.typed_array / u.array */
        case JS_CLASS_BIG_UINT64_ARRAY:  /* u.typed_array / u.array */
#endif
        case JS_CLASS_FLOAT32_ARRAY:     /* u.typed_array / u.array */
        case JS_CLASS_FLOAT64_ARRAY:     /* u.typed_array / u.array */
        case JS_CLASS_DATAVIEW:          /* u.typed_array */
#ifdef CONFIG_BIGNUM
        case JS_CLASS_FLOAT_ENV:         /* u.float_env */
#endif
        case JS_CLASS_MAP:               /* u.map_state */
        case JS_CLASS_SET:               /* u.map_state */
        case JS_CLASS_WEAKMAP:           /* u.map_state */
        case JS_CLASS_WEAKSET:           /* u.map_state */
        case JS_CLASS_MAP_ITERATOR:      /* u.map_iterator_data */
        case JS_CLASS_SET_ITERATOR:      /* u.map_iterator_data */
        case JS_CLASS_ARRAY_ITERATOR:    /* u.array_iterator_data */
        case JS_CLASS_STRING_ITERATOR:   /* u.array_iterator_data */
        case JS_CLASS_PROXY:             /* u.proxy_data */
        case JS_CLASS_PROMISE:           /* u.promise_data */
        case JS_CLASS_PROMISE_RESOLVE_FUNCTION:  /* u.promise_function_data */
        case JS_CLASS_PROMISE_REJECT_FUNCTION:   /* u.promise_function_data */
        case JS_CLASS_ASYNC_FUNCTION_RESOLVE:    /* u.async_function_data */
        case JS_CLASS_ASYNC_FUNCTION_REJECT:     /* u.async_function_data */
        case JS_CLASS_ASYNC_FROM_SYNC_ITERATOR:  /* u.async_from_sync_iterator_data */
        case JS_CLASS_ASYNC_GENERATOR:   /* u.async_generator_data */
            /* TODO */
        default:
            /* XXX: class definition should have an opaque block size */
            if (p->u.opaque) {
                s->memory_used_count += 1;
            }
            break;
        }
    }
    s->obj_size += s->obj_count * sizeof(JSObject);

    /* hashed shapes */
    s->memory_used_count++; /* rt->shape_hash */
    s->memory_used_size += sizeof(rt->shape_hash[0]) * rt->shape_hash_size;
    for(i = 0; i < rt->shape_hash_size; i++) {
        JSShape *sh;
        for(sh = rt->shape_hash[i]; sh != NULL; sh = sh->shape_hash_next) {
            int hash_size = sh->prop_hash_mask + 1;
            s->shape_count++;
            s->shape_size += get_shape_size(hash_size, sh->prop_size);
        }
    }

    /* atoms */
    s->memory_used_count += 2; /* rt->atom_array, rt->atom_hash */
    s->atom_count = rt->atom_count;
    s->atom_size = sizeof(rt->atom_array[0]) * rt->atom_size +
        sizeof(rt->atom_hash[0]) * rt->atom_hash_size;
    for(i = 0; i < rt->atom_size; i++) {
        JSAtomStruct *p = rt->atom_array[i];
        if (!atom_is_free(p)) {
            s->atom_size += (sizeof(*p) + (p->len << p->is_wide_char) +
                             1 - p->is_wide_char);
        }
    }
    s->str_count = round(mem.str_count);
    s->str_size = round(mem.str_size);
    s->js_func_count = mem.js_func_count;
    s->js_func_size = round(mem.js_func_size);
    s->js_func_code_size = mem.js_func_code_size;
    s->js_func_pc2line_count = mem.js_func_pc2line_count;
    s->js_func_pc2line_size = mem.js_func_pc2line_size;
    s->memory_used_count += round(mem.memory_used_count) +
        s->atom_count + s->str_count +
        s->obj_count + s->shape_count +
        s->js_func_count + s->js_func_pc2line_count;
    s->memory_used_size += s->atom_size + s->str_size +
        s->obj_size + s->prop_size + s->shape_size +
        s->js_func_size + s->js_func_code_size + s->js_func_pc2line_size;
}